

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextengine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_141b3c6::Itemizer::generate
          (Itemizer *this,int start,int length,Capitalization caps)

{
  int in_ECX;
  Flags in_ESI;
  undefined8 in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int in_stack_0000000c;
  undefined4 in_stack_00000010;
  
  if (in_ECX == 3) {
    QString::unicode((QString *)0x828703);
    generateScriptItemsSmallCaps
              ((Itemizer *)CONCAT44(caps,in_stack_00000010),
               (ushort *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr_00,
               unaff_retaddr);
  }
  else if (in_ECX == 4) {
    generateScriptItemsCapitalize
              ((Itemizer *)CONCAT44(caps,in_stack_00000010),in_stack_0000000c,in_stack_00000008);
  }
  else if (in_ECX == 0) {
    generateScriptItems((Itemizer *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr_00,
                        unaff_retaddr);
  }
  else {
    generateScriptItemsAndChangeCase
              ((Itemizer *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(int)((ulong)in_RDI >> 0x20),
               (int)in_RDI,in_ESI);
  }
  return;
}

Assistant:

void generate(int start, int length, QFont::Capitalization caps)
    {
        if (caps == QFont::SmallCaps)
            generateScriptItemsSmallCaps(reinterpret_cast<const ushort *>(m_string.unicode()), start, length);
        else if (caps == QFont::Capitalize)
            generateScriptItemsCapitalize(start, length);
        else if (caps != QFont::MixedCase) {
            generateScriptItemsAndChangeCase(start, length,
                caps == QFont::AllLowercase ? QScriptAnalysis::Lowercase : QScriptAnalysis::Uppercase);
        }
        else
            generateScriptItems(start, length);
    }